

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O2

int __thiscall Directory::remove(Directory *this,char *__filename)

{
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  string fullPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,&this->path,"/");
  std::operator+(&local_58,&local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__filename);
  std::__cxx11::string::~string((string *)&local_38);
  iVar2 = ::remove(local_58._M_dataplus._M_p);
  if (iVar2 == 0) {
    bVar1 = refresh(this);
    iVar2 = (int)CONCAT71(extraout_var,bVar1);
  }
  else {
    iVar2 = 0;
  }
  std::__cxx11::string::~string((string *)&local_58);
  return iVar2;
}

Assistant:

bool Directory::remove(std::string name)
{
	std::string fullPath = path + OS_PATHSEP + name;

#ifndef _WIN32
	return (!::remove(fullPath.c_str()) && refresh());
#else
	return (!_unlink(fullPath.c_str()) && refresh());
#endif
}